

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

Iterator __thiscall List<String>::insert(List<String> *this,Iterator *position,String *value)

{
  Item *pIVar1;
  Item *pIVar2;
  ItemBlock *pIVar3;
  Item *insertPos;
  Item *end;
  Item *i;
  ItemBlock *itemBlock;
  Item *item;
  String *value_local;
  Iterator *position_local;
  List<String> *this_local;
  
  itemBlock = (ItemBlock *)this->freeItem;
  if ((Item *)itemBlock == (Item *)0x0) {
    pIVar3 = (ItemBlock *)operator_new__(0xe8);
    pIVar3->next = this->blocks;
    this->blocks = pIVar3;
    for (end = (Item *)(pIVar3 + 1); end < (Item *)(pIVar3 + 0x1d); end = end + 1) {
      end->prev = (Item *)itemBlock;
      itemBlock = (ItemBlock *)end;
    }
    this->freeItem = (Item *)itemBlock;
  }
  Item::Item((Item *)itemBlock,value);
  this->freeItem = (Item *)itemBlock[5].next;
  pIVar1 = position->item;
  pIVar2 = pIVar1->prev;
  itemBlock[5].next = (ItemBlock *)pIVar2;
  if (pIVar2 == (Item *)0x0) {
    (this->_begin).item = (Item *)itemBlock;
  }
  else {
    pIVar1->prev->next = (Item *)itemBlock;
  }
  itemBlock[6].next = (ItemBlock *)pIVar1;
  pIVar1->prev = (Item *)itemBlock;
  this->_size = this->_size + 1;
  Iterator::Iterator((Iterator *)&this_local,(Item *)itemBlock);
  return (Iterator)(Item *)this_local;
}

Assistant:

Iterator insert(const Iterator& position, const T& value)
  {
    Item* item = freeItem;
    if(!item)
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
      {
        i->prev = item;
        item = i;
      }
      freeItem = item;
    }

    new(item) Item(value);
    freeItem = item->prev;

    Item* insertPos = position.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }